

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMNontrappingFPToIntLowering.cpp
# Opt level: O0

UnaryOp __thiscall
wasm::LLVMNonTrappingFPToIntLoweringImpl::getReplacementOp
          (LLVMNonTrappingFPToIntLoweringImpl *this,UnaryOp op)

{
  UnaryOp op_local;
  LLVMNonTrappingFPToIntLoweringImpl *this_local;
  
  switch(op) {
  case TruncSatSFloat32ToInt32:
    this_local._4_4_ = TruncSFloat32ToInt32;
    break;
  case TruncSatUFloat32ToInt32:
    this_local._4_4_ = TruncUFloat32ToInt32;
    break;
  case TruncSatSFloat64ToInt32:
    this_local._4_4_ = TruncSFloat64ToInt32;
    break;
  case TruncSatUFloat64ToInt32:
    this_local._4_4_ = TruncUFloat64ToInt32;
    break;
  case TruncSatSFloat32ToInt64:
    this_local._4_4_ = TruncSFloat32ToInt64;
    break;
  case TruncSatUFloat32ToInt64:
    this_local._4_4_ = TruncUFloat32ToInt64;
    break;
  case TruncSatSFloat64ToInt64:
    this_local._4_4_ = TruncSFloat64ToInt64;
    break;
  case TruncSatUFloat64ToInt64:
    this_local._4_4_ = TruncUFloat64ToInt64;
    break;
  default:
    handle_unreachable("Unexpected opcode",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LLVMNontrappingFPToIntLowering.cpp"
                       ,0x34);
  }
  return this_local._4_4_;
}

Assistant:

UnaryOp getReplacementOp(UnaryOp op) {
    switch (op) {
      case TruncSatSFloat32ToInt32:
        return TruncSFloat32ToInt32;
      case TruncSatUFloat32ToInt32:
        return TruncUFloat32ToInt32;
      case TruncSatSFloat64ToInt32:
        return TruncSFloat64ToInt32;
      case TruncSatUFloat64ToInt32:
        return TruncUFloat64ToInt32;
      case TruncSatSFloat32ToInt64:
        return TruncSFloat32ToInt64;
      case TruncSatUFloat32ToInt64:
        return TruncUFloat32ToInt64;
      case TruncSatSFloat64ToInt64:
        return TruncSFloat64ToInt64;
      case TruncSatUFloat64ToInt64:
        return TruncUFloat64ToInt64;
      default:
        WASM_UNREACHABLE("Unexpected opcode");
    }
  }